

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_TrustedFirst_Test::TestBody(X509Test_TrustedFirst_Test *this)

{
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  bool bVar1;
  char *pcVar2;
  pointer peVar3;
  pointer pxVar4;
  ASN1_TIME *s;
  X509 *pXVar5;
  EVP_PKEY *pEVar6;
  EVP_MD *pEVar7;
  char *in_R9;
  AssertHelper local_7e0;
  Message local_7d8;
  anon_class_1_0_00000001 local_7c9;
  function<void_(x509_store_ctx_st_*)> local_7c8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_7a8;
  allocator<x509_st_*> local_789;
  pointer local_788;
  pointer local_780;
  iterator local_778;
  size_type local_770;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_768;
  allocator<x509_st_*> local_749;
  pointer local_748;
  iterator local_740;
  size_type local_738;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_730;
  int local_718 [2];
  undefined1 local_710 [8];
  AssertionResult gtest_ar_4;
  Message local_6f8;
  anon_class_1_0_00000001 local_6e9;
  function<void_(x509_store_ctx_st_*)> local_6e8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_6c8;
  allocator<x509_st_*> local_6a9;
  pointer local_6a8;
  pointer local_6a0;
  iterator local_698;
  size_type local_690;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_688;
  allocator<x509_st_*> local_669;
  pointer local_668;
  pointer local_660;
  iterator local_658;
  size_type local_650;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_648;
  int local_630 [2];
  undefined1 local_628 [8];
  AssertionResult gtest_ar_3;
  Message local_610;
  function<void_(x509_store_ctx_st_*)> local_608;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_5e8;
  allocator<x509_st_*> local_5c9;
  pointer local_5c8;
  pointer local_5c0;
  iterator local_5b8;
  size_type local_5b0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_5a8;
  allocator<x509_st_*> local_589;
  pointer local_588;
  pointer local_580;
  iterator local_578;
  size_type local_570;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_568;
  int local_550 [2];
  undefined1 local_548 [8];
  AssertionResult gtest_ar_2;
  Message local_530;
  function<void_(x509_store_ctx_st_*)> local_528;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_508;
  allocator<x509_st_*> local_4e1;
  pointer local_4e0;
  pointer local_4d8;
  iterator local_4d0;
  size_type local_4c8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_4c0;
  allocator<x509_st_*> local_4a1;
  pointer local_4a0;
  iterator local_498;
  size_type local_490;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_488;
  int local_470 [2];
  undefined1 local_468 [8];
  AssertionResult gtest_ar_1;
  Message local_450;
  function<void_(x509_store_ctx_st_*)> local_448;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_428;
  allocator<x509_st_*> local_409;
  pointer local_408;
  iterator local_400;
  size_type local_3f8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_3f0;
  allocator<x509_st_*> local_3d1;
  pointer local_3d0;
  iterator local_3c8;
  size_type local_3c0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_3b8;
  int local_3a0 [2];
  undefined1 local_398 [8];
  AssertionResult gtest_ar;
  AssertHelper local_368;
  Message local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_320;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar__10;
  UniquePtr<X509> leaf;
  AssertHelper local_2d8;
  Message local_2d0;
  int local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<X509> intermediate;
  AssertHelper local_248;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_200;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<X509> root1_cross;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<X509> root1;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  ASN1_TIME *local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<X509> root2;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> key;
  X509Test_TrustedFirst_Test *this_local;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar_.message_,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8f28b1,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x10b2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    peVar3 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    MakeTestCert((anon_unknown_dwarf_52317d *)&gtest_ar__1.message_,"Root 2","Root 2",peVar3,true);
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_88,(AssertionResult *)"root2",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x10b6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      s = X509_getm_notAfter(pxVar4);
      local_d0 = ASN1_TIME_adj((ASN1_TIME *)s,0x57e9b680,0,-1);
      testing::AssertionResult::AssertionResult<asn1_string_st*>
                ((AssertionResult *)local_c8,(asn1_string_st **)&local_d0,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_c8,
                   (AssertionResult *)
                   "ASN1_TIME_adj(X509_getm_notAfter(root2.get()), kReferenceTime, 0, -1)","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x10b9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (bVar1) {
        pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__1.message_);
        pEVar6 = (EVP_PKEY *)
                 std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
        ;
        pEVar7 = EVP_sha256();
        local_114 = X509_sign(pXVar5,pEVar6,pEVar7);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_110,&local_114,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&root1,(internal *)local_110,
                     (AssertionResult *)"X509_sign(root2.get(), key.get(), EVP_sha256())","false",
                     "true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x10ba,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&root1);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (bVar1) {
          peVar3 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          MakeTestCert((anon_unknown_dwarf_52317d *)&gtest_ar__4.message_,"Root 1","Root 1",peVar3,
                       true);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_160,
                       (AssertionResult *)"root1","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x10be,pcVar2);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar1) {
            pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__4.message_);
            pEVar6 = (EVP_PKEY *)
                     std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            pEVar7 = EVP_sha256();
            local_1a4 = X509_sign(pXVar5,pEVar6,pEVar7);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&root1_cross,(internal *)local_1a0,
                         (AssertionResult *)"X509_sign(root1.get(), key.get(), EVP_sha256())",
                         "false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10bf,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&root1_cross);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            if (bVar1) {
              peVar3 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              MakeTestCert((anon_unknown_dwarf_52317d *)&gtest_ar__6.message_,"Root 2","Root 1",
                           peVar3,true);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_1f0,
                         (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
              if (!bVar1) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1f0,
                           (AssertionResult *)"root1_cross","false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x10c3,pcVar2);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_1f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
              if (bVar1) {
                pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__6.message_);
                pEVar6 = (EVP_PKEY *)
                         std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                pEVar7 = EVP_sha256();
                local_234 = X509_sign(pXVar5,pEVar6,pEVar7);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_230,&local_234,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_230);
                if (!bVar1) {
                  testing::Message::Message(&local_240);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&intermediate,(internal *)local_230,
                             (AssertionResult *)
                             "X509_sign(root1_cross.get(), key.get(), EVP_sha256())","false","true",
                             in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x10c4,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_248,&local_240);
                  testing::internal::AssertHelper::~AssertHelper(&local_248);
                  std::__cxx11::string::~string((string *)&intermediate);
                  testing::Message::~Message(&local_240);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
                if (bVar1) {
                  peVar3 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  MakeTestCert((anon_unknown_dwarf_52317d *)&gtest_ar__8.message_,"Root 1",
                               "Intermediate",peVar3,true);
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_280,
                             (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_,
                             (type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_280);
                  if (!bVar1) {
                    testing::Message::Message(&local_288);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_280,
                               (AssertionResult *)0x890406,"false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_290,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x10c8,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_290,&local_288);
                    testing::internal::AssertHelper::~AssertHelper(&local_290);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(&local_288);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                  if (bVar1) {
                    pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__8.message_);
                    pEVar6 = (EVP_PKEY *)
                             std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pEVar7 = EVP_sha256();
                    local_2c4 = X509_sign(pXVar5,pEVar6,pEVar7);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_2c0,&local_2c4,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2c0);
                    if (!bVar1) {
                      testing::Message::Message(&local_2d0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&leaf,(internal *)local_2c0,
                                 (AssertionResult *)
                                 "X509_sign(intermediate.get(), key.get(), EVP_sha256())","false",
                                 "true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_2d8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                 ,0x10c9,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
                      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
                      std::__cxx11::string::~string((string *)&leaf);
                      testing::Message::~Message(&local_2d0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
                    if (bVar1) {
                      peVar3 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      MakeTestCert((anon_unknown_dwarf_52317d *)&gtest_ar__10.message_,
                                   "Intermediate","Leaf",peVar3,false);
                      testing::AssertionResult::
                      AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                                ((AssertionResult *)local_310,
                                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__10.message_,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_310);
                      if (!bVar1) {
                        testing::Message::Message(&local_318);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__11.message_,(internal *)local_310,
                                   (AssertionResult *)0x890444,"false","true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_320,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                   ,0x10cd,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_320,&local_318);
                        testing::internal::AssertHelper::~AssertHelper(&local_320);
                        std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                        testing::Message::~Message(&local_318);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
                      if (bVar1) {
                        pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                   ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                    &gtest_ar__10.message_);
                        pEVar6 = (EVP_PKEY *)
                                 std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        pEVar7 = EVP_sha256();
                        local_354 = X509_sign(pXVar5,pEVar6,pEVar7);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_350,&local_354,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_350);
                        if (!bVar1) {
                          testing::Message::Message(&local_360);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar.message_,(internal *)local_350,
                                     (AssertionResult *)
                                     "X509_sign(leaf.get(), key.get(), EVP_sha256())","false","true"
                                     ,in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_368,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                     ,0x10ce,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_368,&local_360);
                          testing::internal::AssertHelper::~AssertHelper(&local_368);
                          std::__cxx11::string::~string((string *)&gtest_ar.message_);
                          testing::Message::~Message(&local_360);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
                        if (bVar1) {
                          local_3a0[1] = 0;
                          pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__10.message_);
                          local_3d0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__4.message_);
                          local_3c8 = &local_3d0;
                          local_3c0 = 1;
                          std::allocator<x509_st_*>::allocator(&local_3d1);
                          __l_08._M_len = local_3c0;
                          __l_08._M_array = local_3c8;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_3b8,__l_08,&local_3d1);
                          local_408 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__8.message_);
                          local_400 = &local_408;
                          local_3f8 = 1;
                          std::allocator<x509_st_*>::allocator(&local_409);
                          __l_07._M_len = local_3f8;
                          __l_07._M_array = local_400;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_3f0,__l_07,&local_409);
                          local_428.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_428.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_428.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector
                                    (&local_428);
                          std::function<void_(x509_store_ctx_st_*)>::function
                                    (&local_448,(nullptr_t)0x0);
                          local_3a0[0] = Verify(pxVar4,&local_3b8,&local_3f0,&local_428,0,&local_448
                                               );
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_398,"0",
                                     "Verify(leaf.get(), {root1.get()}, {intermediate.get()}, {})",
                                     local_3a0 + 1,local_3a0);
                          std::function<void_(x509_store_ctx_st_*)>::~function(&local_448);
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector
                                    (&local_428);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_3f0);
                          std::allocator<x509_st_*>::~allocator(&local_409);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_3b8);
                          std::allocator<x509_st_*>::~allocator(&local_3d1);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_398);
                          if (!bVar1) {
                            testing::Message::Message(&local_450);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_398);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x10d3,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_1.message_,&local_450);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_1.message_);
                            testing::Message::~Message(&local_450);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
                          local_470[1] = 10;
                          pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__10.message_);
                          local_4a0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__1.message_);
                          local_498 = &local_4a0;
                          local_490 = 1;
                          std::allocator<x509_st_*>::allocator(&local_4a1);
                          __l_06._M_len = local_490;
                          __l_06._M_array = local_498;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_488,__l_06,&local_4a1);
                          local_4e0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__8.message_);
                          local_4d8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__6.message_);
                          local_4d0 = &local_4e0;
                          local_4c8 = 2;
                          std::allocator<x509_st_*>::allocator(&local_4e1);
                          __l_05._M_len = local_4c8;
                          __l_05._M_array = local_4d0;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_4c0,__l_05,&local_4e1);
                          local_508.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_508.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_508.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector
                                    (&local_508);
                          std::function<void_(x509_store_ctx_st_*)>::function
                                    (&local_528,(nullptr_t)0x0);
                          local_470[0] = Verify(pxVar4,&local_488,&local_4c0,&local_508,0,&local_528
                                               );
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_468,"10",
                                     "Verify(leaf.get(), {root2.get()}, {intermediate.get(), root1_cross.get()}, {})"
                                     ,local_470 + 1,local_470);
                          std::function<void_(x509_store_ctx_st_*)>::~function(&local_528);
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector
                                    (&local_508);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_4c0);
                          std::allocator<x509_st_*>::~allocator(&local_4e1);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_488);
                          std::allocator<x509_st_*>::~allocator(&local_4a1);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_468);
                          if (!bVar1) {
                            testing::Message::Message(&local_530);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_468);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x10d6,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_2.message_,&local_530);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_2.message_);
                            testing::Message::~Message(&local_530);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
                          local_550[1] = 0;
                          pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__10.message_);
                          local_588 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__4.message_);
                          local_580 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__1.message_);
                          local_578 = &local_588;
                          local_570 = 2;
                          std::allocator<x509_st_*>::allocator(&local_589);
                          __l_04._M_len = local_570;
                          __l_04._M_array = local_578;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_568,__l_04,&local_589);
                          local_5c8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__8.message_);
                          local_5c0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__6.message_);
                          local_5b8 = &local_5c8;
                          local_5b0 = 2;
                          std::allocator<x509_st_*>::allocator(&local_5c9);
                          __l_03._M_len = local_5b0;
                          __l_03._M_array = local_5b8;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_5a8,__l_03,&local_5c9);
                          local_5e8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_5e8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_5e8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector
                                    (&local_5e8);
                          std::function<void_(x509_store_ctx_st_*)>::function
                                    (&local_608,(nullptr_t)0x0);
                          local_550[0] = Verify(pxVar4,&local_568,&local_5a8,&local_5e8,0,&local_608
                                               );
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_548,"0",
                                     "Verify(leaf.get(), {root1.get(), root2.get()}, {intermediate.get(), root1_cross.get()}, {})"
                                     ,local_550 + 1,local_550);
                          std::function<void_(x509_store_ctx_st_*)>::~function(&local_608);
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector
                                    (&local_5e8);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_5a8);
                          std::allocator<x509_st_*>::~allocator(&local_5c9);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_568);
                          std::allocator<x509_st_*>::~allocator(&local_589);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_548);
                          if (!bVar1) {
                            testing::Message::Message(&local_610);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_548);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x10db,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_3.message_,&local_610);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_3.message_);
                            testing::Message::~Message(&local_610);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
                          local_630[1] = 10;
                          pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__10.message_);
                          local_668 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__4.message_);
                          local_660 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__1.message_);
                          local_658 = &local_668;
                          local_650 = 2;
                          std::allocator<x509_st_*>::allocator(&local_669);
                          __l_02._M_len = local_650;
                          __l_02._M_array = local_658;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_648,__l_02,&local_669);
                          local_6a8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__8.message_);
                          local_6a0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__6.message_);
                          local_698 = &local_6a8;
                          local_690 = 2;
                          std::allocator<x509_st_*>::allocator(&local_6a9);
                          __l_01._M_len = local_690;
                          __l_01._M_array = local_698;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_688,__l_01,&local_6a9);
                          local_6c8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_6c8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_6c8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector
                                    (&local_6c8);
                          std::function<void(x509_store_ctx_st*)>::
                          function<(anonymous_namespace)::X509Test_TrustedFirst_Test::TestBody()::__0,void>
                                    ((function<void(x509_store_ctx_st*)> *)&local_6e8,&local_6e9);
                          local_630[0] = Verify(pxVar4,&local_648,&local_688,&local_6c8,0,&local_6e8
                                               );
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_628,"10",
                                     "Verify(leaf.get(), {root1.get(), root2.get()}, {intermediate.get(), root1_cross.get()}, {}, 0, [&](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x8000); })"
                                     ,local_630 + 1,local_630);
                          std::function<void_(x509_store_ctx_st_*)>::~function(&local_6e8);
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector
                                    (&local_6c8);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_688);
                          std::allocator<x509_st_*>::~allocator(&local_6a9);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_648);
                          std::allocator<x509_st_*>::~allocator(&local_669);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_628);
                          if (!bVar1) {
                            testing::Message::Message(&local_6f8);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_628);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x10eb,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_4.message_,&local_6f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_4.message_);
                            testing::Message::~Message(&local_6f8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
                          local_718[1] = 0;
                          pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__10.message_);
                          local_748 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__4.message_);
                          local_740 = &local_748;
                          local_738 = 1;
                          std::allocator<x509_st_*>::allocator(&local_749);
                          __l_00._M_len = local_738;
                          __l_00._M_array = local_740;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_730,__l_00,&local_749);
                          local_788 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__8.message_);
                          local_780 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__6.message_);
                          local_778 = &local_788;
                          local_770 = 2;
                          std::allocator<x509_st_*>::allocator(&local_789);
                          __l._M_len = local_770;
                          __l._M_array = local_778;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_768,__l,&local_789);
                          local_7a8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_7a8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_7a8.
                          super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector
                                    (&local_7a8);
                          std::function<void(x509_store_ctx_st*)>::
                          function<(anonymous_namespace)::X509Test_TrustedFirst_Test::TestBody()::__1,void>
                                    ((function<void(x509_store_ctx_st*)> *)&local_7c8,&local_7c9);
                          local_718[0] = Verify(pxVar4,&local_730,&local_768,&local_7a8,0,&local_7c8
                                               );
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_710,"0",
                                     "Verify(leaf.get(), {root1.get()}, {intermediate.get(), root1_cross.get()}, {}, 0, [&](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x8000); })"
                                     ,local_718 + 1,local_718);
                          std::function<void_(x509_store_ctx_st_*)>::~function(&local_7c8);
                          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector
                                    (&local_7a8);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_768);
                          std::allocator<x509_st_*>::~allocator(&local_789);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_730);
                          std::allocator<x509_st_*>::~allocator(&local_749);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_710);
                          if (!bVar1) {
                            testing::Message::Message(&local_7d8);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_710);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_7e0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x10f5,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_7e0,&local_7d8);
                            testing::internal::AssertHelper::~AssertHelper(&local_7e0);
                            testing::Message::~Message(&local_7d8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
                        }
                      }
                      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__10.message_);
                    }
                  }
                  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_);
                }
              }
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
            }
          }
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
      }
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, TrustedFirst) {
  // Generate the following certificates:
  //
  //                     Root 2 (in store, expired)
  //                       |
  // Root 1 (in store)   Root 1 (cross-sign)
  //          \           /
  //          Intermediate
  //                |
  //               Leaf
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  bssl::UniquePtr<X509> root2 =
      MakeTestCert("Root 2", "Root 2", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root2);
  ASSERT_TRUE(ASN1_TIME_adj(X509_getm_notAfter(root2.get()), kReferenceTime,
                            /*offset_day=*/0,
                            /*offset_sec=*/-1));
  ASSERT_TRUE(X509_sign(root2.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> root1 =
      MakeTestCert("Root 1", "Root 1", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root1);
  ASSERT_TRUE(X509_sign(root1.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> root1_cross =
      MakeTestCert("Root 2", "Root 1", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root1_cross);
  ASSERT_TRUE(X509_sign(root1_cross.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> intermediate =
      MakeTestCert("Root 1", "Intermediate", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(intermediate);
  ASSERT_TRUE(X509_sign(intermediate.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> leaf =
      MakeTestCert("Intermediate", "Leaf", key.get(), /*is_ca=*/false);
  ASSERT_TRUE(leaf);
  ASSERT_TRUE(X509_sign(leaf.get(), key.get(), EVP_sha256()));

  // As a control, confirm that |leaf| -> |intermediate| -> |root1| is valid,
  // but the path through |root1_cross| is expired.
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.get(), {root1.get()}, {intermediate.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.get(), {root2.get()},
                   {intermediate.get(), root1_cross.get()}, {}));

  // By default, we should find the |leaf| -> |intermediate| -> |root2| chain,
  // skipping |root1_cross|.
  EXPECT_EQ(X509_V_OK, Verify(leaf.get(), {root1.get(), root2.get()},
                              {intermediate.get(), root1_cross.get()}, {}));

  // When |X509_V_FLAG_TRUSTED_FIRST| is disabled, we get stuck on the expired
  // intermediate. Note we need the callback to clear the flag. Setting |flags|
  // to zero only skips setting new flags.
  //
  // This test exists to confirm our current behavior, but these modes are just
  // workarounds for not having an actual path-building verifier. If we fix it,
  // this test can be removed.
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.get(), {root1.get(), root2.get()},
                   {intermediate.get(), root1_cross.get()}, {}, /*flags=*/0,
                   [&](X509_STORE_CTX *ctx) {
                     X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
                     X509_VERIFY_PARAM_clear_flags(param,
                                                   X509_V_FLAG_TRUSTED_FIRST);
                   }));

  // Even when |X509_V_FLAG_TRUSTED_FIRST| is disabled, if |root2| is not
  // trusted, the alt chains logic recovers the path.
  EXPECT_EQ(
      X509_V_OK,
      Verify(leaf.get(), {root1.get()}, {intermediate.get(), root1_cross.get()},
             {}, /*flags=*/0, [&](X509_STORE_CTX *ctx) {
               X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
               X509_VERIFY_PARAM_clear_flags(param, X509_V_FLAG_TRUSTED_FIRST);
             }));
}